

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O0

void __thiscall DFsScript::Destroy(DFsScript *this)

{
  DFsScript *this_local;
  
  ClearVariables(this,true);
  ClearSections(this);
  ClearChildren(this);
  TObjPtr<DFsScript>::operator=(&this->parent,(DFsScript *)0x0);
  if ((this->data != (char *)0x0) && (this->data != (char *)0x0)) {
    operator_delete__(this->data);
  }
  this->data = (char *)0x0;
  TObjPtr<DFsScript>::operator=(&this->parent,(DFsScript *)0x0);
  TObjPtr<AActor>::operator=(&this->trigger,(AActor *)0x0);
  DObject::Destroy(&this->super_DObject);
  return;
}

Assistant:

void DFsScript::Destroy()
{
	ClearVariables(true);
	ClearSections();
	ClearChildren();
	parent = NULL;
	if (data != NULL) delete [] data;
	data = NULL;
	parent = NULL;
	trigger = NULL;
	Super::Destroy();
}